

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_unique_int(REF_INT n,REF_INT *original,REF_INT *nunique,REF_INT *unique)

{
  ulong uVar1;
  ulong uVar2;
  
  *nunique = -1;
  ref_sort_insertion_int(n,original,unique);
  uVar2 = 0;
  for (uVar1 = 1; (long)uVar1 < (long)n; uVar1 = uVar1 + 1) {
    uVar2 = (ulong)((uint)(unique[uVar2] != unique[uVar1]) + (int)uVar2);
    if (uVar1 != uVar2) {
      unique[uVar2] = unique[uVar1];
    }
  }
  *nunique = (int)uVar2 + 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_unique_int(REF_INT n, REF_INT *original,
                                       REF_INT *nunique, REF_INT *unique) {
  REF_INT i, j;

  *nunique = REF_EMPTY;

  RSS(ref_sort_insertion_int(n, original, unique), "sort in unique");

  j = 0;
  for (i = 1; i < n; i++) {
    if (unique[j] != unique[i]) j++;
    if (j != i) unique[j] = unique[i];
  }

  *nunique = j + 1;

  return REF_SUCCESS;
}